

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O1

int __thiscall
deqp::egl::GLES2SharedRenderingPerfTests::init
          (GLES2SharedRenderingPerfTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  EglTestContext *pEVar3;
  TestNode *pTVar4;
  int iVar5;
  int extraout_EAX;
  TestCase *pTVar6;
  long *plVar7;
  int iVar8;
  long *plVar9;
  undefined4 uVar10;
  long lVar11;
  undefined2 local_8b;
  char local_89;
  long *local_88;
  long local_78;
  long lStack_70;
  TestCaseGroup *local_68;
  string local_60;
  TestNode *local_40;
  long *local_38;
  
  local_68 = (TestCaseGroup *)operator_new(0x78);
  local_40 = (TestNode *)this;
  TestCaseGroup::TestCaseGroup
            (local_68,(this->super_TestCaseGroup).m_eglTestCtx,"no_shared_context",
             "Tests without sharing contexts.");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000100;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000100;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar4 = local_40;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  local_68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_68,(EglTestContext *)pTVar4[1]._vptr_TestNode,"no_shared_resource",
             "Tests without shared resources.");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar4 = local_40;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  local_68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_68,(EglTestContext *)pTVar4[1]._vptr_TestNode,"shared_coord_buffer",
             "Shared coordinate bufffer");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1010101;
        pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length = 0x10001;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1010101;
        pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length = 0x10001;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar4 = local_40;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  local_68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_68,(EglTestContext *)pTVar4[1]._vptr_TestNode,"shared_index_buffer",
             "Shared index bufffer");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1010101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1010101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar4 = local_40;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  local_68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_68,(EglTestContext *)pTVar4[1]._vptr_TestNode,"shared_texture",
             "Shared texture tests.");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 1;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 1;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar4 = local_40;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  local_68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_68,(EglTestContext *)pTVar4[1]._vptr_TestNode,"shared_program",
             "Shared program tests.");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\x01';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\x01';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar4 = local_40;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  local_68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_68,(EglTestContext *)pTVar4[1]._vptr_TestNode,"shared_all",
             "Share all possible resources.");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length = 0x100010101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1010101;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\x01';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length = 0x100010101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1010101;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\x01';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar4 = local_40;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  local_68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_68,(EglTestContext *)pTVar4[1]._vptr_TestNode,"egl_image","EGL image tests.");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000100;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 2;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000100;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 2;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar4 = local_40;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  local_68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_68,(EglTestContext *)pTVar4[1]._vptr_TestNode,"shared_egl_image",
             "Shared EGLImage tests.");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000100;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 3;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000100;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 3;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar4 = local_40;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  local_68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_68,(EglTestContext *)pTVar4[1]._vptr_TestNode,"shared_egl_image_texture",
             "Shared EGLImage texture tests.");
  plVar7 = (long *)0x0;
  do {
    uVar1 = (&DAT_01bd3df8)[(long)plVar7];
    lVar11 = 0;
    local_38 = plVar7;
    do {
      iVar8 = (int)plVar7;
      iVar2 = *(int *)((long)&DAT_01bd3df8 + lVar11);
      iVar5 = iVar2 * uVar1;
      if ((iVar5 == 4) || (iVar5 == 1)) {
        uVar10 = 10;
        if (iVar5 == 1) {
          uVar10 = 0x28;
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        iVar5 = (int)plVar7;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0x1000003e8;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 4;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestCase *)operator_new(0xe8);
        pEVar3 = (EglTestContext *)local_40[1]._vptr_TestNode;
        egl::(anonymous_namespace)::createTestName_abi_cxx11_
                  (&local_60,(_anonymous_namespace_ *)(ulong)uVar1,iVar2,iVar5);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_78 = *plVar9;
          lStack_70 = plVar7[3];
        }
        else {
          local_78 = *plVar9;
          local_88 = (long *)*plVar7;
        }
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = local_88;
        TestCase::TestCase(pTVar6,pEVar3,NODETYPE_PERFORMANCE,(char *)local_88,
                           glcts::fixed_sample_locations_values + 1);
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__SharedRenderingPerfCase_021556f8;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
        *(undefined4 *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx = uVar10;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx + 4) =
             0x3e800000001;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4)
             = 0x1000101000101;
        *(undefined4 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name._M_string_length + 4)
             = 4;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
        *(undefined2 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 1) =
             local_8b;
        pTVar6[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[3] = local_89;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
             0x8000000080;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
             0x10000000100;
        *(undefined4 *)
         ((long)&pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4) = 0x1e;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_description.field_2 + 8) =
             0;
        *(undefined8 *)&pTVar6[1].super_TestCase.super_TestNode.m_nodeType = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
        pTVar6[1].super_TestCase.super_TestNode.m_children.
        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pTVar6);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    plVar7 = (long *)((long)local_38 + 1);
  } while (plVar7 != (long *)0x3);
  tcu::TestNode::addChild(local_40,(TestNode *)local_68);
  return extraout_EAX;
}

Assistant:

void GLES2SharedRenderingPerfTests::init (void)
{
	TestConfig basicConfig;

	basicConfig.threadCount					= 1;
	basicConfig.perThreadContextCount		= 1;

	basicConfig.sharedContexts				= true;
	basicConfig.frameCount					= 10;
	basicConfig.drawCallCount				= 10;
	basicConfig.triangleCount				= 100;

	basicConfig.useCoordBuffer				= true;
	basicConfig.sharedCoordBuffer			= false;

	basicConfig.useIndices					= true;
	basicConfig.useIndexBuffer				= true;
	basicConfig.sharedIndexBuffer			= false;

	basicConfig.useTexture					= true;
	basicConfig.textureType					= TestConfig::TEXTURETYPE_TEXTURE;

	basicConfig.sharedProgram				= false;

	basicConfig.textureWidth				= 128;
	basicConfig.textureHeight				= 128;

	basicConfig.surfaceWidth				= 256;
	basicConfig.surfaceHeight				= 256;

	const int	threadCounts[]				= { 1, 2, 4 };
	const int	perThreadContextCounts[]	= { 1, 2, 4 };

	// Add no sharing tests
	{
		TestCaseGroup* sharedNoneGroup = new TestCaseGroup(m_eglTestCtx, "no_shared_context", "Tests without sharing contexts.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;
				config.sharedContexts			= false;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedNoneGroup);
	}

	// Add no resource sharing tests
	{
		TestCaseGroup* sharedNoneGroup = new TestCaseGroup(m_eglTestCtx, "no_shared_resource", "Tests without shared resources.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedNoneGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedNoneGroup);
	}

	// Add shared coord buffer tests
	{
		TestCaseGroup* sharedCoordBufferGroup = new TestCaseGroup(m_eglTestCtx, "shared_coord_buffer", "Shared coordinate bufffer");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedCoordBuffer		= true;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedCoordBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedCoordBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedCoordBufferGroup);
	}

	// Add shared index buffer tests
	{
		TestCaseGroup* sharedIndexBufferGroup = new TestCaseGroup(m_eglTestCtx, "shared_index_buffer", "Shared index bufffer");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedIndexBuffer		= true;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedIndexBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedIndexBufferGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedIndexBufferGroup);
	}

	// Add shared texture tests
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "shared_texture", "Shared texture tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.textureType				= TestConfig::TEXTURETYPE_SHARED_TEXTURE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

	// Add shared program tests
	{
		TestCaseGroup* sharedProgramGroup = new TestCaseGroup(m_eglTestCtx, "shared_program", "Shared program tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedProgram			= true;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedProgramGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedProgramGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedProgramGroup);
	}

	// Add shared all tests
	{
		TestCaseGroup* sharedallGroup = new TestCaseGroup(m_eglTestCtx, "shared_all", "Share all possible resources.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.sharedCoordBuffer		= true;
				config.sharedIndexBuffer		= true;
				config.sharedProgram			= true;
				config.textureType				= TestConfig::TEXTURETYPE_SHARED_TEXTURE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedallGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedallGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedallGroup);
	}

	// Add EGLImage tests
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "egl_image", "EGL image tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config = basicConfig;

				config.textureType				= TestConfig::TEXTURETYPE_IMAGE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;
				config.sharedContexts			= false;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

	// Add shared EGLImage tests
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "shared_egl_image", "Shared EGLImage tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;

				config.textureType				= TestConfig::TEXTURETYPE_SHARED_IMAGE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;
				config.sharedContexts			= false;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

	// Shared EGLImage texture test
	{
		TestCaseGroup* sharedTextureGroup = new TestCaseGroup(m_eglTestCtx, "shared_egl_image_texture", "Shared EGLImage texture tests.");

		for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
		{
			int threadCount = threadCounts[threadCountNdx];

			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(perThreadContextCounts); contextCountNdx++)
			{
				int contextCount = perThreadContextCounts[contextCountNdx];

				if (threadCount * contextCount != 4 && threadCount * contextCount != 1)
					continue;

				TestConfig config				= basicConfig;
				config.textureType				= TestConfig::TEXTURETYPE_SHARED_IMAGE_TEXTURE;
				config.threadCount				= threadCount;
				config.perThreadContextCount	= contextCount;

				{
					TestConfig smallConfig		= config;
					smallConfig.triangleCount	= 1;
					smallConfig.drawCallCount	= 1000;
					smallConfig.frameCount		= 10;

					if (threadCount * contextCount == 1)
						smallConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, smallConfig, (createTestName(threadCount, contextCount) + "_small_call").c_str(), ""));
				}

				{
					TestConfig bigConfig	= config;
					bigConfig.triangleCount	= 1000;
					bigConfig.drawCallCount	= 1;
					bigConfig.frameCount	= 10;

					if (threadCount * contextCount == 1)
						bigConfig.frameCount *= 4;

					sharedTextureGroup->addChild(new SharedRenderingPerfCase(m_eglTestCtx, bigConfig, (createTestName(threadCount, contextCount) + "_big_call").c_str(), ""));
				}
			}
		}

		addChild(sharedTextureGroup);
	}

}